

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

Parser * new_subparser(Parser *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Parser *p_00;
  
  p_00 = (Parser *)new_D_Parser(p->t,(p->user).sizeof_user_parse_node);
  iVar1 = (p->user).save_parse_tree;
  iVar2 = (p->user).dont_compare_stacks;
  iVar3 = (p->user).dont_fixup_internal_productions;
  iVar4 = (p->user).fixup_EBNF_productions;
  iVar5 = (p->user).dont_merge_epsilon_trees;
  iVar6 = (p->user).dont_use_height_for_disambiguation;
  iVar7 = (p->user).dont_use_greediness_for_disambiguation;
  iVar8 = (p->user).dont_use_deep_priorities_for_disambiguation;
  iVar9 = (p->user).commit_actions_interval;
  iVar10 = (p->user).error_recovery;
  iVar11 = (p->user).partial_parses;
  (p_00->user).sizeof_user_parse_node = (p->user).sizeof_user_parse_node;
  (p_00->user).save_parse_tree = iVar1;
  (p_00->user).dont_compare_stacks = iVar2;
  (p_00->user).dont_fixup_internal_productions = iVar3;
  (p_00->user).fixup_EBNF_productions = iVar4;
  (p_00->user).dont_merge_epsilon_trees = iVar5;
  (p_00->user).dont_use_height_for_disambiguation = iVar6;
  (p_00->user).dont_use_greediness_for_disambiguation = iVar7;
  (p_00->user).dont_use_deep_priorities_for_disambiguation = iVar8;
  (p_00->user).commit_actions_interval = iVar9;
  (p_00->user).error_recovery = iVar10;
  (p_00->user).partial_parses = iVar11;
  (p_00->user).syntax_errors = (p->user).syntax_errors;
  p_00->end = p->end;
  p_00->pinterface1 = p->pinterface1;
  alloc_parser_working_data(p_00);
  return p_00;
}

Assistant:

Parser *new_subparser(Parser *p) {
  Parser *pp = (Parser *)new_D_Parser(p->t, p->user.sizeof_user_parse_node);
  copy_user_configurables(pp, p);
  pp->end = p->end;
  pp->pinterface1 = p->pinterface1;
  alloc_parser_working_data(pp);
  return pp;
}